

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O3

char * lws_generate_client_handshake(lws *wsi,char *pkt)

{
  uint64_t uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  lws_protocols *p;
  uint8_t *p_00;
  uint8_t *local_30;
  
  pcVar4 = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_SENT_PROTOCOLS);
  pcVar5 = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_METHOD);
  pcVar6 = "GET";
  if (pcVar5 != (char *)0x0) {
    pcVar6 = pcVar5;
  }
  *(ulong *)&wsi->field_0x2dc =
       (ulong)(pcVar5 == (char *)0x0) << 0x2d | *(ulong *)&wsi->field_0x2dc & 0xffffdfffffffffff;
  iVar2 = strcmp(pcVar6,"RAW");
  if (iVar2 == 0) {
    lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
    _lws_log(4,"client transition to raw\n");
    if (pcVar4 != (char *)0x0) {
      p = lws_vhost_name_to_protocol(wsi->vhost,pcVar4);
      if (p == (lws_protocols *)0x0) {
        _lws_log(1,"protocol %s not enabled on vhost\n",pcVar4);
        return (char *)0x0;
      }
      lws_bind_protocol(wsi,p,"lws_generate_client_handshake");
    }
    iVar2 = (*wsi->protocol->callback)(wsi,LWS_CALLBACK_RAW_ADOPT,wsi->user_space,(void *)0x0,0);
    if (iVar2 != 0) {
      return (char *)0x0;
    }
    lws_role_transition(wsi,0x10000000,LRS_ESTABLISHED,&role_ops_raw_skt);
    lws_header_table_detach(wsi,1);
  }
  else {
    pcVar4 = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_URI);
    iVar2 = lws_snprintf(pkt,0x800,"%s %s HTTP/1.1\r\n",pcVar6,pcVar4);
    pcVar4 = pkt + iVar2;
    iVar2 = lws_snprintf(pcVar4,0x40,"Pragma: no-cache\r\nCache-Control: no-cache\r\n");
    pcVar6 = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_HOST);
    iVar3 = lws_snprintf(pcVar4 + iVar2,0x80,"Host: %s\r\n",pcVar6);
    p_00 = (uint8_t *)(pcVar4 + iVar2 + iVar3);
    local_30 = p_00;
    pcVar6 = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_ORIGIN);
    if (pcVar6 != (char *)0x0) {
      uVar1 = wsi->context->options;
      pcVar6 = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_ORIGIN);
      if (((uint)uVar1 >> 0x13 & 1) == 0) {
        pcVar4 = "Origin: http://%s\r\n";
      }
      else {
        pcVar4 = "Origin: %s\r\n";
      }
      iVar2 = lws_snprintf((char *)p_00,0x80,pcVar4,pcVar6);
      p_00 = p_00 + iVar2;
      local_30 = p_00;
    }
    if (((wsi->flags & 0x400) == 0) ||
       (p_00 = lws_http_multipart_headers(wsi,p_00), local_30 = p_00, p_00 != (uint8_t *)0x0)) {
      if ((*(ulong *)&wsi->field_0x2dc & 0x200000000000) == 0) {
        if ((*(ulong *)&wsi->field_0x2dc >> 0x35 & 1) == 0) {
          iVar2 = lws_snprintf((char *)p_00,0x40,"connection: close\r\n");
          p_00 = p_00 + iVar2;
          local_30 = p_00;
        }
      }
      else {
        p_00 = (uint8_t *)lws_generate_client_ws_handshake(wsi,(char *)p_00,"");
        local_30 = p_00;
      }
      iVar2 = (*wsi->protocol->callback)
                        (wsi,LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER,wsi->user_space,&local_30,
                         (size_t)(pkt + ((ulong)wsi->context->pt_serv_buf_size - (long)p_00) + -0xc)
                        );
      if (iVar2 == 0) {
        if ((wsi->flags & 0x800) != 0) {
          iVar2 = lws_snprintf((char *)local_30,0x80,
                               "Content-Type: application/x-www-form-urlencoded\r\n");
          local_30 = local_30 + iVar2;
          iVar2 = lws_snprintf((char *)local_30,0x80,"Content-Length: %lu\r\n",
                               (wsi->http).writeable_len);
          local_30 = local_30 + iVar2;
          *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc | 0x1000000000000;
        }
        iVar2 = lws_snprintf((char *)local_30,4,"\r\n");
        local_30 = local_30 + iVar2;
        if ((*(ulong *)&wsi->field_0x2dc & 0x1000000000000) == 0) {
          return (char *)local_30;
        }
        lws_callback_on_writable(wsi);
        return (char *)local_30;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *
lws_generate_client_handshake(struct lws *wsi, char *pkt)
{
	const char *meth, *pp = lws_hdr_simple_ptr(wsi,
				_WSI_TOKEN_CLIENT_SENT_PROTOCOLS);
	char *p = pkt, *p1;

	meth = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_METHOD);
	if (!meth) {
		meth = "GET";
		wsi->do_ws = 1;
	} else {
		wsi->do_ws = 0;
	}

	if (!strcmp(meth, "RAW")) {
		lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);
		lwsl_notice("client transition to raw\n");

		if (pp) {
			const struct lws_protocols *pr;

			pr = lws_vhost_name_to_protocol(wsi->vhost, pp);

			if (!pr) {
				lwsl_err("protocol %s not enabled on vhost\n",
					 pp);
				return NULL;
			}

			lws_bind_protocol(wsi, pr, __func__);
		}

		if ((wsi->protocol->callback)(wsi, LWS_CALLBACK_RAW_ADOPT,
					      wsi->user_space, NULL, 0))
			return NULL;

		lws_role_transition(wsi, LWSIFR_CLIENT, LRS_ESTABLISHED,
				    &role_ops_raw_skt);
		lws_header_table_detach(wsi, 1);

		return NULL;
	}

	/*
	 * 04 example client handshake
	 *
	 * GET /chat HTTP/1.1
	 * Host: server.example.com
	 * Upgrade: websocket
	 * Connection: Upgrade
	 * Sec-WebSocket-Key: dGhlIHNhbXBsZSBub25jZQ==
	 * Sec-WebSocket-Origin: http://example.com
	 * Sec-WebSocket-Protocol: chat, superchat
	 * Sec-WebSocket-Version: 4
	 */

	p += lws_snprintf(p, 2048, "%s %s HTTP/1.1\x0d\x0a", meth,
		     lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_URI));

	p += lws_snprintf(p, 64, "Pragma: no-cache\x0d\x0a"
			"Cache-Control: no-cache\x0d\x0a");

	p += lws_snprintf(p, 128, "Host: %s\x0d\x0a",
		     lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_HOST));

	if (lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_ORIGIN)) {
		if (lws_check_opt(wsi->context->options,
				  LWS_SERVER_OPTION_JUST_USE_RAW_ORIGIN))
			p += lws_snprintf(p, 128, "Origin: %s\x0d\x0a",
				     lws_hdr_simple_ptr(wsi,
						     _WSI_TOKEN_CLIENT_ORIGIN));
		else
			p += lws_snprintf(p, 128, "Origin: http://%s\x0d\x0a",
				     lws_hdr_simple_ptr(wsi,
						     _WSI_TOKEN_CLIENT_ORIGIN));
	}

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME) {
		p1 = (char *)lws_http_multipart_headers(wsi, (uint8_t *)p);
		if (!p1)
			return NULL;
		p = p1;
	}

#if defined(LWS_WITH_HTTP_PROXY)
	if (wsi->parent &&
	    lws_hdr_total_length(wsi->parent, WSI_TOKEN_HTTP_CONTENT_LENGTH)) {
		p += lws_snprintf(p, 128, "Content-Length: %s\x0d\x0a",
			lws_hdr_simple_ptr(wsi->parent, WSI_TOKEN_HTTP_CONTENT_LENGTH));
		if (atoi(lws_hdr_simple_ptr(wsi->parent, WSI_TOKEN_HTTP_CONTENT_LENGTH)))
			wsi->client_http_body_pending = 1;
	}
	if (wsi->parent &&
	    lws_hdr_total_length(wsi->parent, WSI_TOKEN_HTTP_AUTHORIZATION)) {
		p += lws_snprintf(p, 128, "Authorization: %s\x0d\x0a",
			lws_hdr_simple_ptr(wsi->parent, WSI_TOKEN_HTTP_AUTHORIZATION));
	}
	if (wsi->parent &&
	    lws_hdr_total_length(wsi->parent, WSI_TOKEN_HTTP_CONTENT_TYPE)) {
		p += lws_snprintf(p, 128, "Content-Type: %s\x0d\x0a",
			lws_hdr_simple_ptr(wsi->parent, WSI_TOKEN_HTTP_CONTENT_TYPE));
	}
#endif

#if defined(LWS_ROLE_WS)
	if (wsi->do_ws) {
		const char *conn1 = "";
	//	if (!wsi->client_pipeline)
	//		conn1 = "close, ";
		p = lws_generate_client_ws_handshake(wsi, p, conn1);
	} else
#endif
	{
		if (!wsi->client_pipeline)
			p += lws_snprintf(p, 64, "connection: close\x0d\x0a");
	}

	/* give userland a chance to append, eg, cookies */

	if (wsi->protocol->callback(wsi,
			LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER,
			wsi->user_space, &p,
			(pkt + wsi->context->pt_serv_buf_size) - p - 12))
		return NULL;

	if (wsi->flags & LCCSCF_HTTP_X_WWW_FORM_URLENCODED) {
		p += lws_snprintf(p, 128, "Content-Type: application/x-www-form-urlencoded\x0d\x0a");
		p += lws_snprintf(p, 128, "Content-Length: %lu\x0d\x0a", wsi->http.writeable_len);
		lws_client_http_body_pending(wsi, 1);
	}

	p += lws_snprintf(p, 4, "\x0d\x0a");

	if (wsi->client_http_body_pending)
		lws_callback_on_writable(wsi);

	// puts(pkt);

	return p;
}